

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O0

int Abc_CommandNChooseK(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int local_5c;
  int local_58;
  int parameterizedCombK;
  int c;
  int directive;
  Aig_Man_t *pAigCombStabil;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pNtkCombStabil;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  parameterizedCombK = -1;
  pNtk = (Abc_Ntk_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  pNtkTemp = Abc_FrameReadNtk(pAbc);
  if (argv_local._4_4_ == 1) {
    if (parameterizedCombK != -1) {
      __assert_fail("directive == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                    ,0x2de,"int Abc_CommandNChooseK(Abc_Frame_t *, int, char **)");
    }
    parameterizedCombK = 0;
  }
  else {
    Extra_UtilGetoptReset();
LAB_00737d44:
    local_58 = Extra_UtilGetopt(argv_local._4_4_,(char **)pNtk,"cmCgh");
    if (local_58 != -1) {
      switch(local_58) {
      case 0x43:
        parameterizedCombK = 3;
        goto LAB_00737d44;
      default:
        break;
      case 99:
        parameterizedCombK = 1;
        goto LAB_00737d44;
      case 0x67:
        parameterizedCombK = 4;
        goto LAB_00737d44;
      case 0x68:
        break;
      case 0x6d:
        goto switchD_00737d82_caseD_6d;
      }
      fprintf(_stdout,"usage: nck [-cmgCh]\n");
      fprintf(_stdout,"\tgenerates combinatorial signals for stabilization\n");
      fprintf(_stdout,"\t-h : print usage\n");
      return 1;
    }
    local_58 = -1;
  }
  iVar1 = Abc_NtkIsStrash(pNtkTemp);
  if (iVar1 == 0) {
    printf("The input network was not strashed, strashing....\n");
    pNtkCombStabil = Abc_NtkStrash(pNtkTemp,0,0,0);
    pAigCombStabil = Abc_NtkToDar(pNtkCombStabil,0,1);
  }
  else {
    pAigCombStabil = Abc_NtkToDar(pNtkTemp,0,1);
    pNtkCombStabil = pNtkTemp;
  }
  printf("Enter parameterizedCombK = ");
  iVar1 = __isoc99_scanf("%d",&local_5c);
  if (iVar1 == 1) {
    printf("\n");
    _c = generateGeneralDisjunctiveTester(pNtkTemp,pAigCombStabil,local_5c);
    Aig_ManPrintStats(_c);
    pAig = (Aig_Man_t *)Abc_NtkFromAigPhase(_c);
    pcVar2 = Abc_UtilStrsav(_c->pName);
    pAig->pSpec = pcVar2;
    iVar1 = Abc_NtkCheck((Abc_Ntk_t *)pAig);
    if (iVar1 == 0) {
      fprintf(_stdout,"Abc_NtkCreateCone(): Network check has failed.\n");
    }
    Abc_FrameSetCurrentNetwork(pAStack_18,(Abc_Ntk_t *)pAig);
    Aig_ManStop(_c);
    Aig_ManStop(pAigCombStabil);
    pAbc_local._4_4_ = 1;
  }
  else {
    printf("\nFailed to read integer!\n");
    pAbc_local._4_4_ = 0;
  }
  return pAbc_local._4_4_;
switchD_00737d82_caseD_6d:
  parameterizedCombK = 2;
  goto LAB_00737d44;
}

Assistant:

int Abc_CommandNChooseK( Abc_Frame_t * pAbc, int argc, char ** argv )
{
	Abc_Ntk_t * pNtk, * pNtkTemp, *pNtkCombStabil;
	Aig_Man_t * pAig, *pAigCombStabil;
	int directive = -1;
	int c;
	int parameterizedCombK;

	pNtk = Abc_FrameReadNtk(pAbc);


	/*************************************************
	Extraction of Command Line Argument	
	*************************************************/
	if( argc == 1 )
	{
		assert( directive == -1 );
		directive = SIMPLE_kCS;
	}
	else
	{
		Extra_UtilGetoptReset();
		while ( ( c = Extra_UtilGetopt( argc, argv, "cmCgh" ) ) != EOF )
		{
			switch( c )
			{
			case 'c':
				directive = kCS_WITH_SAFETY_INVARIANTS; 
				break;
			case 'm':
				directive = kCS_WITH_DISCOVER_MONOTONE_SIGNALS; 
				break;
			case 'C':
				directive = kCS_WITH_SAFETY_AND_DCS_INVARIANTS;
				break;
			case 'g':
				directive = kCS_WITH_SAFETY_AND_USER_GIVEN_DCS_INVARIANTS;
				break;
			case 'h':
				goto usage;
				break;
			default:
				goto usage;
			}
		}
	}
	/*************************************************
	Extraction of Command Line Argument Ends	
	*************************************************/

	if( !Abc_NtkIsStrash( pNtk ) )
	{
		printf("The input network was not strashed, strashing....\n");
		pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
		pAig = Abc_NtkToDar( pNtkTemp, 0, 1 );
	}
	else
	{
		pAig = Abc_NtkToDar( pNtk, 0, 1 );
		pNtkTemp = pNtk;
	}

/**********************Code for generation of nCk outputs**/
	//combCount = countCombination(1000, 3);
	//pAigCombStabil = generateDisjunctiveTester( pNtk, pAig, 7, 2 );
	printf("Enter parameterizedCombK = " );
	if( scanf("%d", &parameterizedCombK) != 1 )
	{
		printf("\nFailed to read integer!\n");
		return 0;
	}
	printf("\n");

	pAigCombStabil = generateGeneralDisjunctiveTester( pNtk, pAig, parameterizedCombK );
	Aig_ManPrintStats(pAigCombStabil);
	pNtkCombStabil = Abc_NtkFromAigPhase( pAigCombStabil );
	pNtkCombStabil->pName = Abc_UtilStrsav( pAigCombStabil->pName );
	if ( !Abc_NtkCheck( pNtkCombStabil ) )
	        fprintf( stdout, "Abc_NtkCreateCone(): Network check has failed.\n" );
	Abc_FrameSetCurrentNetwork( pAbc, pNtkCombStabil );

	Aig_ManStop( pAigCombStabil );
	Aig_ManStop( pAig );

	return 1;
	//printf("\ncombCount = %d\n", combCount);
	//exit(0);
/**********************************************************/

	usage:
		fprintf( stdout, "usage: nck [-cmgCh]\n" );
    		fprintf( stdout, "\tgenerates combinatorial signals for stabilization\n" );
		fprintf( stdout, "\t-h : print usage\n");
    		return 1;

}